

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

void __thiscall
vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
prepare_next_dimension
          (vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_> *this,
          int dimension)

{
  pointer ppfVar1;
  index_t in_ESI;
  compressed_distance_matrix<(compressed_matrix_layout)0> *in_RDI;
  rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
  *unaff_retaddr;
  binomial_coeff_table *in_stack_ffffffffffffffe8;
  compressed_distance_matrix<(compressed_matrix_layout)0> *_dist;
  
  _dist = in_RDI;
  if (((in_RDI->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0) &&
     (ppfVar1 = (in_RDI->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_start, ppfVar1 != (pointer)0x0)) {
    rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
    ~rips_filtration_comparator
              ((rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                *)0x164b2c);
    operator_delete(ppfVar1,0x30);
  }
  ppfVar1 = (pointer)operator_new(0x30);
  rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
  rips_filtration_comparator(unaff_retaddr,_dist,in_ESI,in_stack_ffffffffffffffe8);
  (in_RDI->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppfVar1;
  if (((in_RDI->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
       super__Vector_impl_data._M_finish != (pointer)0x0) &&
     (ppfVar1 = (in_RDI->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                super__Vector_impl_data._M_finish, ppfVar1 != (pointer)0x0)) {
    rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
    ~rips_filtration_comparator
              ((rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>
                *)0x164b9c);
    operator_delete(ppfVar1,0x30);
  }
  ppfVar1 = (pointer)operator_new(0x30);
  rips_filtration_comparator<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
  rips_filtration_comparator(unaff_retaddr,_dist,in_ESI,in_stack_ffffffffffffffe8);
  (in_RDI->rows).super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppfVar1;
  if (0 < in_ESI) {
    *(int *)((long)&(in_RDI->distances).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 4) =
         *(int *)((long)&(in_RDI->distances).super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 4) + 1;
  }
  return;
}

Assistant:

void prepare_next_dimension(int dimension) {
		if (comparator != nullptr) delete comparator;
		comparator = new rips_filtration_comparator<DistanceMatrix>(distance_matrix, dimension, binomial_coeff);

		if (next_comparator != nullptr) delete next_comparator;
		next_comparator =
		    new rips_filtration_comparator<DistanceMatrix>(distance_matrix, dimension + 1, binomial_coeff);

		if (dimension > 0) current_dimension++;
	}